

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataControllerDefault.cpp
# Opt level: O0

void __thiscall Rml::DataControllerValue::ProcessEvent(DataControllerValue *this,Event *event)

{
  bool bVar1;
  Dictionary *this_00;
  pointer ppVar2;
  undefined8 uVar3;
  DataModel *this_01;
  Type TVar4;
  reference variable_name;
  DataVariable DVar5;
  undefined1 local_c0 [8];
  DataVariable variable;
  DataModel *model;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_80;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_78;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_70;
  const_iterator value_it;
  const_iterator override_value_it;
  Dictionary *parameters;
  Variant value_to_set;
  Element *element;
  Event *event_local;
  DataControllerValue *this_local;
  
  value_to_set.data._24_8_ = DataController::GetElement(&this->super_DataController);
  if ((Element *)value_to_set.data._24_8_ != (Element *)0x0) {
    Variant::Variant((Variant *)&parameters);
    this_00 = Event::GetParameters_abi_cxx11_(event);
    value_it = itlib::
               flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
               ::find<char[28]>(this_00,(char (*) [28])"data-binding-override-value");
    local_70._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
          *)itlib::
            flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
            ::find<char[6]>(this_00,(char (*) [6])0x70c2fa);
    local_78._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
          *)itlib::
            flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
            ::cend(this_00);
    bVar1 = __gnu_cxx::operator!=(&value_it,&local_78);
    if (bVar1) {
      ppVar2 = __gnu_cxx::
               __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
               ::operator->(&value_it);
      Variant::operator=((Variant *)&parameters,&ppVar2->second);
    }
    else {
      local_80._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
            *)itlib::
              flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
              ::cend(this_00);
      bVar1 = __gnu_cxx::operator!=(&local_70,&local_80);
      if (bVar1) {
        ppVar2 = __gnu_cxx::
                 __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                 ::operator->(&local_70);
        Variant::operator=((Variant *)&parameters,&ppVar2->second);
      }
      else {
        Element::GetAddress_abi_cxx11_
                  ((String *)&model,(Element *)value_to_set.data._24_8_,false,true);
        uVar3 = ::std::__cxx11::string::c_str();
        Log::Message(LT_WARNING,
                     "A \'change\' event was received, but it did not contain the attribute \'value\' when processing a data binding in %s"
                     ,uVar3);
        ::std::__cxx11::string::~string((string *)&model);
      }
    }
    this_01 = Element::GetDataModel((Element *)value_to_set.data._24_8_);
    TVar4 = Variant::GetType((Variant *)&parameters);
    if ((TVar4 == NONE) || (this_01 == (DataModel *)0x0)) {
      variable.ptr._4_4_ = 1;
    }
    else {
      DVar5 = DataModel::GetVariable(this_01,&this->address);
      variable.definition = (VariableDefinition *)DVar5.ptr;
      local_c0 = (undefined1  [8])DVar5.definition;
      bVar1 = DataVariable::operator_cast_to_bool((DataVariable *)local_c0);
      if ((bVar1) &&
         (bVar1 = DataVariable::Set((DataVariable *)local_c0,(Variant *)&parameters), bVar1)) {
        variable_name =
             ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::front
                       (&this->address);
        DataModel::DirtyVariable(this_01,&variable_name->name);
      }
      variable.ptr._4_4_ = 0;
    }
    Variant::~Variant((Variant *)&parameters);
  }
  return;
}

Assistant:

void DataControllerValue::ProcessEvent(Event& event)
{
	if (const Element* element = GetElement())
	{
		Variant value_to_set;
		const auto& parameters = event.GetParameters();
		const auto override_value_it = parameters.find("data-binding-override-value");
		const auto value_it = parameters.find("value");
		if (override_value_it != parameters.cend())
			value_to_set = override_value_it->second;
		else if (value_it != parameters.cend())
			value_to_set = value_it->second;
		else
			Log::Message(Log::LT_WARNING,
				"A 'change' event was received, but it did not contain the attribute 'value' when processing a data binding in %s",
				element->GetAddress().c_str());

		DataModel* model = element->GetDataModel();
		if (value_to_set.GetType() == Variant::NONE || !model)
			return;

		if (DataVariable variable = model->GetVariable(address))
			if (variable.Set(value_to_set))
				model->DirtyVariable(address.front().name);
	}
}